

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barcode.h
# Opt level: O3

void __thiscall
barcode_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::
new_infinite_barcode
          (barcode_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *this,
          value_t birth)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             &(this->
              super_file_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>)
              .outstream," [",2);
  poVar1 = std::ostream::_M_insert<double>((double)birth);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", )",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

inline void new_infinite_barcode(value_t birth) {
		file_output_t<Complex>::outstream << " [" << birth << ", )" << std::endl;
	}